

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline.h
# Opt level: O3

string * __thiscall cmdline::parser::usage_abi_cxx11_(string *__return_storage_ptr__,parser *this)

{
  ulong *puVar1;
  ulong uVar2;
  string *psVar3;
  int iVar4;
  ostream *poVar5;
  pointer ppoVar6;
  undefined4 extraout_var;
  pointer ppoVar7;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  char *pcVar11;
  ostringstream oss;
  char local_1d0;
  undefined7 uStack_1cf;
  long local_1c8;
  long local_1c0 [2];
  string *local_1b0;
  long local_1a8 [14];
  ios_base local_138 [264];
  
  local_1b0 = __return_storage_ptr__;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"usage: ",7);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,(this->prog_name)._M_dataplus._M_p,
                      (this->prog_name)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
  ppoVar6 = (this->ordered).
            super__Vector_base<cmdline::parser::option_base_*,_std::allocator<cmdline::parser::option_base_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->ordered).
      super__Vector_base<cmdline::parser::option_base_*,_std::allocator<cmdline::parser::option_base_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppoVar6) {
    uVar9 = 0;
    do {
      iVar4 = (*ppoVar6[uVar9]->_vptr_option_base[7])();
      if ((char)iVar4 != '\0') {
        (*(this->ordered).
          super__Vector_base<cmdline::parser::option_base_*,_std::allocator<cmdline::parser::option_base_*>_>
          ._M_impl.super__Vector_impl_data._M_start[uVar9]->_vptr_option_base[0xb])(&local_1d0);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,(char *)CONCAT71(uStack_1cf,local_1d0),local_1c8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
        if ((long *)CONCAT71(uStack_1cf,local_1d0) != local_1c0) {
          operator_delete((long *)CONCAT71(uStack_1cf,local_1d0),local_1c0[0] + 1);
        }
      }
      uVar9 = uVar9 + 1;
      ppoVar6 = (this->ordered).
                super__Vector_base<cmdline::parser::option_base_*,_std::allocator<cmdline::parser::option_base_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar9 < (ulong)((long)(this->ordered).
                                   super__Vector_base<cmdline::parser::option_base_*,_std::allocator<cmdline::parser::option_base_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppoVar6 >> 3))
    ;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[options] ... ",0xe);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,(this->ftr)._M_dataplus._M_p,(this->ftr)._M_string_length
                     );
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"options:",8);
  std::ios::widen((char)(ostream *)local_1a8 + (char)*(undefined8 *)(local_1a8[0] + -0x18));
  std::ostream::put((char)(ostream *)local_1a8);
  std::ostream::flush();
  ppoVar7 = (this->ordered).
            super__Vector_base<cmdline::parser::option_base_*,_std::allocator<cmdline::parser::option_base_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppoVar6 = (this->ordered).
            super__Vector_base<cmdline::parser::option_base_*,_std::allocator<cmdline::parser::option_base_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ppoVar6 == ppoVar7) {
    uVar9 = 4;
  }
  else {
    uVar10 = 0;
    uVar9 = 0;
    do {
      iVar4 = (*ppoVar7[uVar10]->_vptr_option_base[8])();
      uVar2 = *(ulong *)(CONCAT44(extraout_var,iVar4) + 8);
      if (uVar9 <= uVar2) {
        uVar9 = uVar2;
      }
      uVar10 = uVar10 + 1;
      ppoVar7 = (this->ordered).
                super__Vector_base<cmdline::parser::option_base_*,_std::allocator<cmdline::parser::option_base_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppoVar6 = (this->ordered).
                super__Vector_base<cmdline::parser::option_base_*,_std::allocator<cmdline::parser::option_base_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    } while (uVar10 < (ulong)((long)ppoVar6 - (long)ppoVar7 >> 3));
    uVar9 = uVar9 + 4;
  }
  if (ppoVar6 != ppoVar7) {
    uVar10 = 0;
    do {
      iVar4 = (*ppoVar7[uVar10]->_vptr_option_base[9])();
      if ((char)iVar4 == '\0') {
        lVar8 = 6;
        pcVar11 = "      ";
        poVar5 = (ostream *)local_1a8;
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"  -",3);
        iVar4 = (*(this->ordered).
                  super__Vector_base<cmdline::parser::option_base_*,_std::allocator<cmdline::parser::option_base_*>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar10]->_vptr_option_base[9])();
        local_1d0 = (char)iVar4;
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,&local_1d0,1);
        lVar8 = 2;
        pcVar11 = ", ";
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar11,lVar8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"--",2);
      iVar4 = (*(this->ordered).
                super__Vector_base<cmdline::parser::option_base_*,_std::allocator<cmdline::parser::option_base_*>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar10]->_vptr_option_base[8])();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,*(char **)CONCAT44(extraout_var_00,iVar4),
                 ((undefined8 *)CONCAT44(extraout_var_00,iVar4))[1]);
      iVar4 = (*(this->ordered).
                super__Vector_base<cmdline::parser::option_base_*,_std::allocator<cmdline::parser::option_base_*>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar10]->_vptr_option_base[8])();
      puVar1 = (ulong *)(CONCAT44(extraout_var_01,iVar4) + 8);
      lVar8 = uVar9 - *puVar1;
      if (*puVar1 <= uVar9 && lVar8 != 0) {
        do {
          local_1d0 = ' ';
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,&local_1d0,1);
          lVar8 = lVar8 + -1;
        } while (lVar8 != 0);
      }
      iVar4 = (*(this->ordered).
                super__Vector_base<cmdline::parser::option_base_*,_std::allocator<cmdline::parser::option_base_*>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar10]->_vptr_option_base[10])();
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,*(char **)CONCAT44(extraout_var_02,iVar4),
                          ((undefined8 *)CONCAT44(extraout_var_02,iVar4))[1]);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
      uVar10 = uVar10 + 1;
      ppoVar7 = (this->ordered).
                super__Vector_base<cmdline::parser::option_base_*,_std::allocator<cmdline::parser::option_base_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar10 < (ulong)((long)(this->ordered).
                                    super__Vector_base<cmdline::parser::option_base_*,_std::allocator<cmdline::parser::option_base_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppoVar7 >> 3)
            );
  }
  psVar3 = local_1b0;
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  return psVar3;
}

Assistant:

std::string usage() const {
    std::ostringstream oss;
    oss<<"usage: "<<prog_name<<" ";
    for (size_t i=0; i<ordered.size(); i++){
      if (ordered[i]->must())
        oss<<ordered[i]->short_description()<<" ";
    }
    
    oss<<"[options] ... "<<ftr<<std::endl;
    oss<<"options:"<<std::endl;

    size_t max_width=0;
    for (size_t i=0; i<ordered.size(); i++){
      max_width=std::max(max_width, ordered[i]->name().length());
    }
    for (size_t i=0; i<ordered.size(); i++){
      if (ordered[i]->short_name()){
        oss<<"  -"<<ordered[i]->short_name()<<", ";
      }
      else{
        oss<<"      ";
      }

      oss<<"--"<<ordered[i]->name();
      for (size_t j=ordered[i]->name().length(); j<max_width+4; j++)
        oss<<' ';
      oss<<ordered[i]->description()<<std::endl;
    }
    return oss.str();
  }